

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  Mem *pVal;
  double dVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  uchar uVar15;
  uchar uVar16;
  uint uVar17;
  ulong uVar18;
  byte *__s;
  char *zDate;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  int Y;
  int M;
  double r;
  undefined8 local_98;
  double local_90;
  sqlite3_context *local_88;
  int local_80;
  int local_7c;
  DateTime local_78;
  double local_48;
  int *local_40;
  ulong local_38;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 == 0) {
      return 1;
    }
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
          [pVal->flags & 0x3f] - 1) {
    pcVar11 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar11 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar11;
    uVar18 = (ulong)(cVar1 == '-');
    iVar5 = getDigits(pcVar11 + uVar18,"40f-21a-21d",&local_98,&local_7c,&local_80);
    if (iVar5 == 3) {
      zDate = pcVar11 + uVar18 + 9;
      do {
        do {
          pbVar7 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar5 = parseHhMmSs(zDate,p);
      if (iVar5 != 0) {
        if (*zDate != '\0') goto LAB_001bbd26;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -(int)local_98;
      if (cVar1 != '-') {
        iVar5 = (int)local_98;
      }
      p->Y = iVar5;
      p->M = local_7c;
      p->D = local_80;
      if (p->validTZ != '\0') {
        computeJD(p);
      }
    }
    else {
LAB_001bbd26:
      iVar5 = parseHhMmSs(pcVar11,p);
      if (iVar5 != 0) {
        lVar13 = 0;
        do {
          bVar4 = pcVar11[lVar13];
          if (bVar4 == "now"[lVar13]) {
            if ((ulong)bVar4 == 0) goto LAB_001bbd78;
          }
          else if (""[bVar4] != ""[(byte)"now"[lVar13]]) goto LAB_001bbd9c;
          lVar13 = lVar13 + 1;
        } while( true );
      }
    }
    goto LAB_001bbe23;
  }
  dVar2 = sqlite3VdbeRealValue(pVal);
  uVar20 = SUB84(dVar2,0);
  uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_001bbc0e:
  p->s = (double)CONCAT44(uVar21,uVar20);
  p->rawS = '\x01';
  if ((0.0 <= (double)CONCAT44(uVar21,uVar20)) &&
     ((double)CONCAT44(uVar21,uVar20) <= 5373484.5 && (double)CONCAT44(uVar21,uVar20) != 5373484.5))
  {
    p->iJD = (long)((double)CONCAT44(uVar21,uVar20) * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
LAB_001bbe23:
  local_88 = context;
  if (argc < 2) {
LAB_001bc832:
    computeJD(p);
    uVar17 = 1;
    if (p->isError == '\0') {
      uVar17 = (uint)(0x1a6401072fdff < (ulong)p->iJD);
    }
    return uVar17;
  }
  local_40 = &p->Y;
  local_38 = (ulong)(uint)argc;
  uVar18 = 1;
LAB_001bbe5f:
  pbVar7 = (byte *)sqlite3ValueText(argv[uVar18],'\x01');
  sqlite3ValueBytes(argv[uVar18],'\x01');
  if (pbVar7 == (byte *)0x0) {
    return 1;
  }
  bVar4 = *pbVar7;
  bVar12 = ""[bVar4];
  uVar17 = (uint)bVar12;
  if (bVar12 < 0x6c) {
    uVar14 = (ulong)(uVar17 - 0x2b);
    if (0x3f < uVar17 - 0x2b) {
      return 1;
    }
    if ((0x7fe5UL >> (uVar14 & 0x3f) & 1) == 0) {
      if (uVar14 == 0x36) {
        lVar13 = 0;
        do {
          if (bVar4 == "auto"[lVar13]) {
            if (bVar4 == 0) goto LAB_001bc39d;
          }
          else if (""[bVar4] != ""[(byte)"auto"[lVar13]]) {
            return 1;
          }
          bVar4 = pbVar7[lVar13 + 1];
          lVar13 = lVar13 + 1;
        } while( true );
      }
      if (uVar14 != 0x3f) {
        return 1;
      }
      lVar13 = 0;
      do {
        if (bVar4 == "julianday"[lVar13]) {
          if (bVar4 == 0) goto LAB_001bc2e7;
        }
        else if (""[bVar4] != ""[(byte)"julianday"[lVar13]]) {
          return 1;
        }
        bVar4 = pbVar7[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while( true );
    }
    lVar13 = 1;
    __s = pbVar7;
    while( true ) {
      bVar12 = pbVar7[lVar13];
      if (((bVar12 == 0) || (bVar12 == 0x3a)) || ((""[bVar12] & 1) != 0)) break;
      lVar13 = lVar13 + 1;
      __s = __s + 1;
    }
    iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&local_98,(int)lVar13,'\x01');
    if (iVar5 < 1) {
      return 1;
    }
    if (bVar12 == 0x3a) {
      local_78.s = 0.0;
      local_78.validJD = '\0';
      local_78.rawS = '\0';
      local_78.validYMD = '\0';
      local_78.validHMS = '\0';
      local_78.validTZ = '\0';
      local_78.tzSet = '\0';
      local_78.isError = '\0';
      local_78._47_1_ = 0;
      local_78.D = 0;
      local_78.h = 0;
      local_78.m = 0;
      local_78.tz = 0;
      local_78.iJD = 0;
      local_78.Y = 0;
      local_78.M = 0;
      iVar6 = parseHhMmSs((char *)(pbVar7 + ((ulong)bVar4 - 0x3a < 0xfffffffffffffff6)),&local_78);
      iVar5 = 1;
      if (iVar6 == 0) {
        computeJD(&local_78);
        lVar10 = (local_78.iJD + -43200000) % 86400000;
        lVar13 = -lVar10;
        if (*pbVar7 != 0x2d) {
          lVar13 = lVar10;
        }
        computeJD(p);
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
        p->iJD = p->iJD + lVar13;
        iVar5 = 0;
      }
    }
    else {
      do {
        pbVar7 = __s + 1;
        __s = __s + 1;
      } while ((""[*pbVar7] & 1) != 0);
      sVar8 = strlen((char *)__s);
      uVar17 = (uint)sVar8 & 0x3fffffff;
      if (uVar17 - 0xb < 0xfffffff8) {
        return 1;
      }
      if ((__s[uVar17 - 1] & 0xdf) == 0x53) {
        uVar17 = uVar17 - 1;
      }
      computeJD(p);
      dVar3 = (double)CONCAT44(local_98._4_4_,(int)local_98);
      dVar2 = *(double *)(&DAT_001e3e90 + (ulong)(dVar3 < 0.0) * 8);
      lVar10 = 0x1e3c11;
      lVar13 = 0;
      do {
        if (uVar17 == aXformType[lVar13].nName) {
          uVar14 = 0;
          do {
            if ((ulong)*(byte *)(lVar10 + uVar14) == 0) {
              uVar16 = ""[__s[uVar14]];
              uVar15 = '\0';
LAB_001bc089:
              if (uVar15 != uVar16) goto LAB_001bc0b4;
              break;
            }
            uVar15 = ""[*(byte *)(lVar10 + uVar14)];
            uVar16 = ""[__s[uVar14]];
            if (uVar15 != uVar16) goto LAB_001bc089;
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
          if (((double)-aXformType[lVar13].rLimit < dVar3) &&
             (dVar3 < (double)aXformType[lVar13].rLimit)) {
            local_90 = dVar3;
            local_48 = dVar2;
            if ((int)lVar13 == 5) {
              iVar5 = (int)dVar3;
              computeYMD(p);
              computeHMS(p);
              p->Y = p->Y + iVar5;
LAB_001bc75e:
              p->validJD = '\0';
              local_90 = local_90 - (double)iVar5;
            }
            else if ((int)lVar13 == 4) {
              computeYMD(p);
              computeHMS(p);
              iVar5 = (int)local_90;
              iVar6 = p->M + iVar5;
              if (iVar6 == 0 || SCARRY4(p->M,iVar5) != iVar6 < 0) {
                uVar17 = -((0xcU - iVar6) / 0xc);
              }
              else {
                uVar17 = (iVar6 - 1U) / 0xc;
              }
              p->Y = p->Y + uVar17;
              p->M = iVar6 + uVar17 * -0xc;
              goto LAB_001bc75e;
            }
            computeJD(p);
            p->iJD = p->iJD + (long)((double)aXformType[lVar13].rXform * local_90 * 1000.0 +
                                    local_48);
            iVar5 = 0;
            goto LAB_001bc7a7;
          }
        }
LAB_001bc0b4:
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar13 != 6);
      iVar5 = 1;
LAB_001bc7a7:
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->validTZ = '\0';
    }
    goto LAB_001bc7b8;
  }
  if (bVar12 < 0x75) {
    if (uVar17 == 0x6c) {
      lVar13 = 0;
      do {
        if (bVar4 == "localtime"[lVar13]) {
          if (bVar4 == 0) goto LAB_001bc3c7;
        }
        else if (""[bVar4] != ""[(byte)"localtime"[lVar13]]) {
          return 1;
        }
        bVar4 = pbVar7[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while( true );
    }
    if (uVar17 != 0x73) {
      return 1;
    }
    uVar15 = '\0';
    if (bVar4 == 0) {
      pcVar11 = "start of ";
    }
    else {
      lVar13 = 0;
      do {
        lVar10 = lVar13;
        uVar15 = ""[bVar4];
        if (uVar15 != ""[(byte)"start of "[lVar10]]) {
          pcVar11 = "start of " + lVar10;
          goto LAB_001bc507;
        }
        if (lVar10 == 8) goto LAB_001bc516;
        bVar4 = pbVar7[lVar10 + 1];
        lVar13 = lVar10 + 1;
      } while (bVar4 != 0);
      pcVar11 = "start of " + lVar10 + 1;
      uVar15 = '\0';
    }
LAB_001bc507:
    if (uVar15 != ""[(byte)*pcVar11]) {
      return 1;
    }
LAB_001bc516:
    if (((p->validJD == '\0') && (p->validYMD == '\0')) && (p->validHMS == '\0')) {
      return 1;
    }
    computeYMD(p);
    p->validHMS = '\x01';
    p->validTZ = '\0';
    p->h = 0;
    p->m = 0;
    p->s = 0.0;
    p->validJD = '\0';
    p->rawS = '\0';
    lVar13 = 0;
    do {
      bVar4 = pbVar7[lVar13 + 9];
      if (bVar4 == "month"[lVar13]) {
        if ((ulong)bVar4 == 0) goto LAB_001bc590;
      }
      else if (""[bVar4] != ""[(byte)"month"[lVar13]]) {
        lVar13 = 0;
        goto LAB_001bc59e;
      }
      lVar13 = lVar13 + 1;
    } while( true );
  }
  if (uVar17 != 0x77) {
    if (uVar17 != 0x75) {
      return 1;
    }
    lVar13 = 0;
    bVar12 = bVar4;
    do {
      if (bVar12 == "unixepoch"[lVar13]) {
        if (bVar12 == 0) goto LAB_001bc31b;
      }
      else if (""[bVar12] != ""[(byte)"unixepoch"[lVar13]]) goto LAB_001bc36a;
      bVar12 = pbVar7[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while( true );
  }
  uVar15 = '\0';
  if (bVar4 == 0) {
    pcVar11 = "weekday ";
  }
  else {
    lVar13 = 0;
    do {
      lVar10 = lVar13;
      uVar15 = ""[bVar4];
      if (uVar15 != ""[(byte)"weekday "[lVar10]]) {
        pcVar11 = "weekday " + lVar10;
        goto LAB_001bc60f;
      }
      if (lVar10 == 7) goto LAB_001bc61e;
      bVar4 = pbVar7[lVar10 + 1];
      lVar13 = lVar10 + 1;
    } while (bVar4 != 0);
    pcVar11 = "weekday " + lVar10 + 1;
    uVar15 = '\0';
  }
LAB_001bc60f:
  if (uVar15 != ""[(byte)*pcVar11]) {
    return 1;
  }
LAB_001bc61e:
  sVar8 = strlen((char *)(pbVar7 + 8));
  iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&local_98,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar5 < 1) {
    return 1;
  }
  dVar2 = (double)CONCAT44(local_98._4_4_,(int)local_98);
  if (dVar2 < 0.0) {
    return 1;
  }
  if (7.0 <= dVar2) {
    return 1;
  }
  if (dVar2 != (double)(int)dVar2) {
    return 1;
  }
  if (NAN(dVar2) || NAN((double)(int)dVar2)) {
    return 1;
  }
  computeYMD(p);
  computeHMS(p);
  p->validTZ = '\0';
  p->validJD = '\0';
  computeJD(p);
  lVar13 = (p->iJD + 0x7b98a00) / 86400000;
  lVar10 = (lVar13 / 7) * -7 + -7 + lVar13;
  if (lVar13 % 7 <= (long)(int)dVar2) {
    lVar10 = lVar13 % 7;
  }
  p->iJD = ((int)dVar2 - lVar10) * 86400000 + p->iJD;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  goto LAB_001bc821;
LAB_001bbd78:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 != 0) {
    iVar5 = setDateTimeToCurrent(context,p);
    if (iVar5 != 0) {
      return 1;
    }
    goto LAB_001bbe23;
  }
LAB_001bbd9c:
  sVar8 = strlen(pcVar11);
  iVar5 = sqlite3AtoF(pcVar11,(double *)&local_78,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar5 < 1) {
    return 1;
  }
  uVar20 = (undefined4)local_78.iJD;
  uVar21 = (undefined4)((ulong)local_78.iJD >> 0x20);
  goto LAB_001bbc0e;
LAB_001bc31b:
  if (p->rawS == '\0') {
LAB_001bc36a:
    lVar13 = 0;
    do {
      if (bVar4 == "utc"[lVar13]) {
        if (bVar4 == 0) goto LAB_001bc431;
      }
      else if (""[bVar4] != ""[(byte)"utc"[lVar13]]) {
        return 1;
      }
      bVar4 = pbVar7[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while( true );
  }
  if (1 < uVar18) {
    return 1;
  }
  dVar2 = p->s * 1000.0 + 210866760000000.0;
  if (dVar2 < 0.0) {
    return 1;
  }
  if (464269060800000.0 <= dVar2) {
    return 1;
  }
LAB_001bc7f2:
  p->validTZ = '\0';
  p->iJD = (long)(dVar2 + 0.5);
  p->validJD = '\x01';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  goto LAB_001bc821;
LAB_001bc431:
  iVar5 = sqlite3NotPureFunc(local_88);
  if (iVar5 == 0) {
    return 1;
  }
  if (p->tzSet == '\0') {
    computeJD(p);
    lVar13 = p->iJD;
    lVar9 = 0;
    lVar10 = lVar13;
    uVar17 = 0;
    do {
      local_78.m = 0;
      local_78.tz = 0;
      local_78.s = 0.0;
      local_78.Y = 0;
      local_78.M = 0;
      local_78.D = 0;
      local_78.h = 0;
      lVar10 = lVar10 - (int)lVar9;
      local_78.validJD = '\x01';
      local_78.rawS = '\0';
      local_78.validYMD = '\0';
      local_78.validHMS = '\0';
      local_78.validTZ = '\0';
      local_78.tzSet = '\0';
      local_78.isError = '\0';
      local_78._47_1_ = 0;
      local_78.iJD = lVar10;
      iVar5 = toLocaltime(&local_78,local_88);
      if (iVar5 != 0) {
        return 1;
      }
      computeJD(&local_78);
      lVar9 = local_78.iJD - lVar13;
    } while (((int)lVar9 != 0) && (bVar19 = uVar17 < 3, uVar17 = uVar17 + 1, bVar19));
    *(undefined8 *)(local_40 + 4) = 0;
    *(double *)(local_40 + 6) = 0.0;
    local_40[0] = 0;
    local_40[1] = 0;
    *(undefined8 *)(local_40 + 2) = 0;
    *(undefined8 *)(local_40 + 8) = 0;
    p->iJD = lVar10;
    p->validJD = '\x01';
    p->tzSet = '\x01';
  }
  goto LAB_001bc821;
LAB_001bc3c7:
  iVar5 = sqlite3NotPureFunc(local_88);
  if (iVar5 == 0) {
    return 1;
  }
  iVar5 = toLocaltime(p,local_88);
LAB_001bc7b8:
  if (iVar5 != 0) {
    return 1;
  }
LAB_001bc821:
  uVar18 = uVar18 + 1;
  if (uVar18 == local_38) goto LAB_001bc832;
  goto LAB_001bbe5f;
LAB_001bc59e:
  bVar4 = pbVar7[lVar13 + 9];
  if (bVar4 == "year"[lVar13]) {
    if ((ulong)bVar4 == 0) goto LAB_001bc5c0;
  }
  else if (""[bVar4] != ""[(byte)"year"[lVar13]]) {
    lVar13 = 0;
    goto LAB_001bc5d5;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001bc59e;
LAB_001bc5d5:
  bVar4 = pbVar7[lVar13 + 9];
  if (bVar4 == "julianday"[lVar13 + 6]) {
    if ((ulong)bVar4 == 0) goto LAB_001bc821;
  }
  else if (""[bVar4] != ""[(byte)"julianday"[lVar13 + 6]]) {
    return 1;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001bc5d5;
LAB_001bc5c0:
  p->M = 1;
  p->D = 1;
  goto LAB_001bc821;
LAB_001bc590:
  p->D = 1;
  goto LAB_001bc821;
LAB_001bc39d:
  if (1 < uVar18) {
    return 1;
  }
  if ((p->rawS != '\0') && (p->validJD == '\0')) {
    dVar2 = p->s;
    if (dVar2 < -210866760000.0) {
      return 1;
    }
    if (253402300799.0 < dVar2) {
      return 1;
    }
    dVar2 = dVar2 * 1000.0 + 210866760000000.0;
    goto LAB_001bc7f2;
  }
  goto LAB_001bc3be;
LAB_001bc2e7:
  if (1 < uVar18) {
    return 1;
  }
  if (p->validJD == '\0') {
    return 1;
  }
  if (p->rawS == '\0') {
    return 1;
  }
LAB_001bc3be:
  p->rawS = '\0';
  goto LAB_001bc821;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}